

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauGia.c
# Opt level: O3

int Dsm_ManTruthToGia(void *p,word *pTruth,Vec_Int_t *vLeaves,Vec_Int_t *vCover)

{
  uint uVar1;
  int iVar2;
  word pTruthCopy [64];
  char pDsd [1000];
  word awStack_618 [64];
  char local_418 [1008];
  
  iVar2 = vLeaves->nSize;
  uVar1 = 1 << ((char)iVar2 - 6U & 0x1f);
  if (iVar2 < 7) {
    uVar1 = 1;
  }
  if (0 < (int)uVar1) {
    memcpy(awStack_618,pTruth,(ulong)uVar1 << 3);
  }
  m_Calls = m_Calls + 1;
  if (iVar2 < 0xd) {
    if (iVar2 == 1) {
      if (*vLeaves->pArray < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x132,"int Abc_LitNotCond(int, int)");
      }
      uVar1 = (uint)*pTruth & 1 ^ *vLeaves->pArray;
    }
    else if (iVar2 == 0) {
      uVar1 = (uint)*pTruth & 1;
    }
    else {
      iVar2 = Dau_DsdDecompose(awStack_618,iVar2,0,1,local_418);
      if (iVar2 != 0) {
        m_NonDsd = m_NonDsd + 1;
      }
      if (*(long *)((long)p + 0xa0) == 0) {
        uVar1 = Dau_DsdToGia2((Gia_Man_t *)p,local_418,vLeaves->pArray,vCover);
      }
      else {
        uVar1 = Dau_DsdToGia((Gia_Man_t *)p,local_418,vLeaves->pArray,vCover);
      }
    }
    return uVar1;
  }
  __assert_fail("Vec_IntSize(vLeaves) <= DAU_DSD_MAX_VAR",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauGia.c"
                ,0x1c3,"int Dsm_ManTruthToGia(void *, word *, Vec_Int_t *, Vec_Int_t *)");
}

Assistant:

int Dsm_ManTruthToGia( void * p, word * pTruth, Vec_Int_t * vLeaves, Vec_Int_t * vCover )
{
    int fUseMuxes = 0;
    int fDelayBalance = 1;
    Gia_Man_t * pGia = (Gia_Man_t *)p;
    int nSizeNonDec;
    char pDsd[1000];
    word pTruthCopy[DAU_MAX_WORD];
    Abc_TtCopy( pTruthCopy, pTruth, Abc_TtWordNum(Vec_IntSize(vLeaves)), 0 );
    m_Calls++;
    assert( Vec_IntSize(vLeaves) <= DAU_DSD_MAX_VAR );
    if ( Vec_IntSize(vLeaves) == 0 )
        return (int)(pTruth[0] & 1);
    if ( Vec_IntSize(vLeaves) == 1 )
        return Abc_LitNotCond( Vec_IntEntry(vLeaves, 0), (int)(pTruth[0] & 1) );
    // collect delay information
    if ( fDelayBalance && fUseMuxes )
    {
        int i, iLit, pVarLevels[DAU_DSD_MAX_VAR];
        Vec_IntForEachEntry( vLeaves, iLit, i )
            pVarLevels[i] = Gia_ObjLevelId( pGia, Abc_Lit2Var(iLit) );
        nSizeNonDec = Dau_DsdDecomposeLevel( pTruthCopy, Vec_IntSize(vLeaves), fUseMuxes, 1, pDsd, pVarLevels );
    }
    else
        nSizeNonDec = Dau_DsdDecompose( pTruthCopy, Vec_IntSize(vLeaves), fUseMuxes, 1, pDsd );
    if ( nSizeNonDec )
        m_NonDsd++;
//    printf( "%s\n", pDsd );
    if ( fDelayBalance && pGia->vLevels )
        return Dau_DsdToGia( pGia, pDsd, Vec_IntArray(vLeaves), vCover );
    else
        return Dau_DsdToGia2( pGia, pDsd, Vec_IntArray(vLeaves), vCover );
}